

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O0

bool __thiscall iutest::floating_point<double>::AlmostEquals(floating_point<double> *this,_Myt *rhs)

{
  bool bVar1;
  _Myt *rhs_local;
  floating_point<double> *this_local;
  
  bVar1 = is_nan(this);
  if ((!bVar1) && (bVar1 = is_nan(rhs), !bVar1)) {
    bVar1 = NanSensitiveAlmostEquals(this,rhs);
    return bVar1;
  }
  return false;
}

Assistant:

bool    AlmostEquals(const _Myt& rhs) const
    {
        if( is_nan() || rhs.is_nan() )
        {
            return false;
        }
        return NanSensitiveAlmostEquals(rhs);
    }